

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O2

void __thiscall
SharedTimedMutexTest_TryLockFor_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
::SharedTimedMutexTest_TryLockFor_Test
          (SharedTimedMutexTest_TryLockFor_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
           *this)

{
  SharedTimedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>::
  SharedTimedMutexTest
            (&this->
              super_SharedTimedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
            );
  (this->
  super_SharedTimedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__Test_002c0278;
  return;
}

Assistant:

TYPED_TEST(SharedTimedMutexTest, TryLockFor)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  std::atomic<int> nread = {};
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-thread
        ph.await();     // p1
        EXPECT_TRUE(mtx.try_lock_for(TEST_NOT_TIMEOUT));
        EXPECT_EQ(TEST_READER_THREADS, nread);
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ASSERT_NO_THROW(mtx.lock_shared());
        ph.advance(1);  // p1
        ++nread;
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}